

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O2

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint *puVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  uint16_t i_1;
  __uid_t _Var8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint32_t uVar12;
  mac_address mVar13;
  ixgbe_device *dev;
  char *pcVar14;
  uint8_t *puVar15;
  interrupt_queues *piVar16;
  void *pvVar17;
  ulong uVar18;
  void *pvVar19;
  mempool *pmVar20;
  pkt_buf *ppVar21;
  uint uVar22;
  undefined8 uVar23;
  uint16_t i_2;
  ushort uVar24;
  uint uVar25;
  char *pcVar26;
  byte bVar27;
  long lVar28;
  long *plVar29;
  long lVar30;
  uint32_t rx_queue;
  ulong uVar31;
  ulong uVar32;
  uint16_t i;
  long lVar33;
  long lVar34;
  bool bVar35;
  dma_memory dVar36;
  ulong in_stack_ffffffffffffeed8;
  undefined4 uVar37;
  long local_10f8;
  stat buffer;
  char path [4096];
  
  _Var8 = getuid();
  if (_Var8 != 0) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): Not running as root, this will probably fail\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x203,"ixgbe_init");
  }
  uVar32 = (ulong)rx_queues;
  if (rx_queues < 0x41) {
    if (tx_queues < 0x41) {
      dev = (ixgbe_device *)malloc(0x88);
      pcVar14 = strdup(pci_addr);
      (dev->ixy).pci_addr = pcVar14;
      bVar27 = 0;
      snprintf(path,0x1000,"/sys/bus/pci/devices/%s/iommu_group",pci_addr);
      iVar9 = stat(path,(stat *)&buffer);
      (dev->ixy).vfio = iVar9 == 0;
      if (iVar9 == 0) {
        iVar9 = vfio_init(pci_addr);
        (dev->ixy).vfio_fd = iVar9;
        if (iVar9 < 0) {
          fprintf(_stderr,"[ERROR] %s:%d %s(): could not initialize the IOMMU for device %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x21a,"ixgbe_init",pci_addr);
          abort();
        }
        bVar27 = (dev->ixy).vfio;
      }
      (dev->ixy).driver_name = driver_name;
      (dev->ixy).num_rx_queues = rx_queues;
      (dev->ixy).num_tx_queues = tx_queues;
      (dev->ixy).rx_batch = ixgbe_rx_batch;
      (dev->ixy).tx_batch = ixgbe_tx_batch;
      (dev->ixy).read_stats = ixgbe_read_stats;
      (dev->ixy).set_promisc = ixgbe_set_promisc;
      (dev->ixy).get_link_speed = ixgbe_get_link_speed;
      (dev->ixy).get_mac_addr = ixgbe_get_mac_addr;
      (dev->ixy).set_mac_addr = ixgbe_set_mac_addr;
      (dev->ixy).interrupts.interrupts_enabled = interrupt_timeout != 0;
      (dev->ixy).interrupts.itr_rate = 0x28;
      (dev->ixy).interrupts.timeout_ms = interrupt_timeout;
      if ((interrupt_timeout != 0) && ((bVar27 & 1) == 0)) {
        fprintf(_stderr,
                "[WARN ] %s:%d %s(): Interrupts requested but VFIO not available: Disabling Interrupts!\n"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x22d,"ixgbe_init");
        (dev->ixy).interrupts.interrupts_enabled = false;
        bVar27 = (dev->ixy).vfio;
      }
      if ((bVar27 & 1) == 0) {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via pci file...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x238,"ixgbe_init");
        puVar15 = pci_map_resource(pci_addr);
        dev->addr = puVar15;
      }
      else {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via VFIO...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x233,"ixgbe_init");
        puVar15 = vfio_map_region((dev->ixy).vfio_fd,0);
        dev->addr = puVar15;
        if ((dev->ixy).interrupts.interrupts_enabled == true) {
          piVar16 = (interrupt_queues *)malloc((ulong)(dev->ixy).num_rx_queues * 0x68);
          (dev->ixy).interrupts.queues = piVar16;
          uVar10 = vfio_setup_interrupt((dev->ixy).vfio_fd);
          (dev->ixy).interrupts.interrupt_type = (uint8_t)uVar10;
          if ((uint8_t)uVar10 == '\x01') {
            iVar9 = vfio_enable_msi((dev->ixy).vfio_fd);
            iVar11 = vfio_epoll_ctl(iVar9);
            uVar24 = (dev->ixy).num_rx_queues;
            for (lVar33 = 0; (ulong)uVar24 * 0x68 - lVar33 != 0; lVar33 = lVar33 + 0x68) {
              piVar16 = (dev->ixy).interrupts.queues;
              *(int *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x40) = iVar9;
              *(int *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x3c) = iVar11;
              *(undefined8 *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x10) = 0;
              *(undefined8 *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x18) =
                   1000000000;
            }
          }
          else if ((uVar10 & 0xff) == 2) {
            lVar33 = 0x34;
            for (uVar31 = 0; uVar31 < (dev->ixy).num_rx_queues; uVar31 = uVar31 + 1) {
              iVar9 = vfio_enable_msix((dev->ixy).vfio_fd,(uint32_t)uVar31);
              iVar11 = vfio_epoll_ctl(iVar9);
              piVar16 = (dev->ixy).interrupts.queues;
              *(int *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x74) = iVar9;
              *(int *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x70) = iVar11;
              *(undefined8 *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x44) = 0;
              *(undefined8 *)((long)(piVar16->moving_avg).measured_rates + lVar33 + -0x4c) =
                   1000000000;
              lVar33 = lVar33 + 0x68;
            }
          }
          else {
            fprintf(_stderr,"[WARN ] %s:%d %s(): Interrupt type not supported: %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                    ,0x106,"setup_interrupts",(ulong)(uVar10 & 0xff));
          }
        }
      }
      pvVar17 = calloc(uVar32,0x8018);
      dev->rx_queues = pvVar17;
      pvVar17 = calloc((ulong)tx_queues,0x8010);
      dev->tx_queues = pvVar17;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x1bf,"reset_and_init",(dev->ixy).pci_addr);
      disable_interrupts(dev);
      puVar15 = dev->addr;
      puVar15[0] = '\b';
      puVar15[1] = '\0';
      puVar15[2] = '\0';
      puVar15[3] = '\x04';
      puVar1 = (uint *)dev->addr;
      while (uVar37 = (undefined4)(in_stack_ffffffffffffeed8 >> 0x20), (*puVar1 & 0x4000008) != 0) {
        in_stack_ffffffffffffeed8 = in_stack_ffffffffffffeed8 & 0xffffffff00000000;
        fprintf(_stderr,
                "[DEBUG] %s:%d %s(): waiting for flags 0x%08X in register 0x%05X to clear, current value 0x%08X\n"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/device.h"
                ,0x7a,"wait_clear_reg32",0x4000008,in_stack_ffffffffffffeed8,*puVar1);
        usleep(10000);
      }
      usleep(10000);
      disable_interrupts(dev);
      mVar13 = ixgbe_get_mac_addr((ixy_device *)dev);
      uVar10 = mVar13.addr._0_4_;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x1cd,"reset_and_init",(dev->ixy).pci_addr);
      pvVar17 = (void *)(CONCAT44(uVar37,uVar10 >> 8) & 0xffffffff000000ff);
      fprintf(_stdout,"[INFO ] %s:%d %s(): MAC address %02x:%02x:%02x:%02x:%02x:%02x\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x1ce,"reset_and_init",(ulong)(uVar10 & 0xff),pvVar17,uVar10 >> 0x10 & 0xff,
              uVar10 >> 0x18,mVar13.addr._4_2_ & 0xff,(uint)(ushort)(mVar13.addr._4_2_ >> 8));
      wait_set_reg32(dev->addr,0x10010,0x200);
      wait_set_reg32(dev->addr,0x2f00,8);
      *(uint *)(dev->addr + 0x42a0) = *(uint *)(dev->addr + 0x42a0) & 0xffff1fff | 0x6000;
      *(uint *)(dev->addr + 0x42a0) = *(uint *)(dev->addr + 0x42a0) & 0xfffffe7f;
      *(uint *)(dev->addr + 0x42a0) = *(uint *)(dev->addr + 0x42a0) | 0x1000;
      ixgbe_read_stats((ixy_device *)dev,(device_stats *)0x0);
      *(uint *)(dev->addr + 0x3000) = *(uint *)(dev->addr + 0x3000) & 0xfffffffe;
      puVar15 = dev->addr;
      puVar15[0x3c00] = '\0';
      puVar15[0x3c01] = '\0';
      puVar15[0x3c02] = '\x02';
      puVar15[0x3c03] = '\0';
      for (lVar33 = 0; puVar15 = dev->addr, lVar33 != 7; lVar33 = lVar33 + 1) {
        puVar15 = puVar15 + lVar33 * 4 + 0x3c04;
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
      }
      uVar32 = 0x2100;
      *(uint *)(puVar15 + 0x4240) = *(uint *)(puVar15 + 0x4240) | 2;
      *(uint *)(dev->addr + 0x2f00) = *(uint *)(dev->addr + 0x2f00) | 2;
      *(uint *)(dev->addr + 0x5080) = *(uint *)(dev->addr + 0x5080) | 0x400;
      local_10f8 = 0x12;
      uVar10 = 0;
      for (uVar31 = 0; uVar31 < (dev->ixy).num_rx_queues; uVar31 = uVar31 + 1) {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing rx queue %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x15a,"init_rx",uVar31 & 0xffffffff,pvVar17);
        uVar18 = uVar32;
        if (0xf < uVar31) {
          if (uVar31 < 0x40) {
            uVar18 = uVar31 * 0x40 | 0x1014;
          }
          else {
            uVar18 = uVar31 * 0x40 + 0xc014;
          }
        }
        *(uint *)(dev->addr + uVar18) = *(uint *)(dev->addr + uVar18) & 0xf1ffffff | 0x2000000;
        if (uVar31 < 0x10) {
          uVar22 = (uint)uVar32;
          uVar25 = uVar10;
        }
        else {
          uVar25 = (int)uVar31 * 0x40;
          if (uVar31 < 0x40) {
            uVar22 = uVar25 | 0x1014;
          }
          else {
            uVar22 = uVar25 + 0xc014;
          }
        }
        uVar3 = uVar25 + 0xc018;
        if (uVar31 < 0x40) {
          uVar3 = uVar25 | 0x1018;
        }
        uVar4 = uVar25 + 0xc010;
        if (uVar31 < 0x40) {
          uVar4 = uVar25 | 0x1010;
        }
        uVar5 = uVar25 + 0xc008;
        if (uVar31 < 0x40) {
          uVar5 = uVar25 | 0x1008;
        }
        uVar6 = uVar25 + 0xc004;
        if (uVar31 < 0x40) {
          uVar6 = uVar25 | 0x1004;
        }
        uVar7 = uVar25 + 0xc000;
        if (uVar31 < 0x40) {
          uVar7 = uVar25 | 0x1000;
        }
        *(uint *)(dev->addr + uVar22) = *(uint *)(dev->addr + uVar22) | 0x10000000;
        dVar36 = memory_allocate_dma(0x2000,true);
        pvVar19 = dVar36.virt;
        memset(pvVar19,0xff,0x2000);
        *(int *)(dev->addr + uVar7) = (int)dVar36.phy;
        *(int *)(dev->addr + uVar6) = dVar36.phy._4_4_;
        puVar15 = dev->addr + uVar5;
        puVar15[0] = '\0';
        puVar15[1] = ' ';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d phy addr:  0x%012lX\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x169,"init_rx",uVar31 & 0xffffffff,dVar36.phy);
        pvVar17 = pvVar19;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d virt addr: 0x%012lX\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x16a,"init_rx",uVar31 & 0xffffffff,pvVar19);
        puVar15 = dev->addr + uVar4;
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        puVar15 = dev->addr + uVar3;
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        pvVar2 = dev->rx_queues;
        *(undefined4 *)((long)pvVar2 + local_10f8 + -2) = 0x200;
        *(void **)((long)pvVar2 + local_10f8 + -0x12) = pvVar19;
        local_10f8 = local_10f8 + 0x18;
        uVar10 = uVar10 + 0x40;
        uVar32 = uVar32 + 4;
      }
      *(uint *)(dev->addr + 0x18) = *(uint *)(dev->addr + 0x18) | 0x10000;
      uVar25 = 0x2200;
      for (uVar10 = 0; puVar15 = dev->addr, uVar10 < (dev->ixy).num_rx_queues; uVar10 = uVar10 + 1)
      {
        uVar22 = uVar25;
        if (0xf < uVar10) {
          if (uVar10 < 0x40) {
            uVar22 = uVar10 * 0x40 | 0x100c;
          }
          else {
            uVar22 = uVar10 * 0x40 + 0xc00c;
          }
        }
        uVar25 = uVar25 + 4;
        *(uint *)(puVar15 + uVar22) = *(uint *)(puVar15 + uVar22) & 0xffffefff;
      }
      *(uint *)(puVar15 + 0x3000) = *(uint *)(puVar15 + 0x3000) | 1;
      *(uint *)(dev->addr + 0x4240) = *(uint *)(dev->addr + 0x4240) | 0x401;
      puVar15 = dev->addr;
      puVar15[0xcc00] = '\0';
      puVar15[0xcc01] = 0xa0;
      puVar15[0xcc02] = '\0';
      puVar15[0xcc03] = '\0';
      for (lVar33 = 0; puVar15 = dev->addr, lVar33 != 7; lVar33 = lVar33 + 1) {
        puVar15 = puVar15 + lVar33 * 4 + 0xcc04;
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
      }
      puVar15[0x8100] = 0xff;
      puVar15[0x8101] = 0xff;
      puVar15[0x8102] = '\0';
      puVar15[0x8103] = '\0';
      lVar33 = 0;
      *(uint *)(dev->addr + 0x4900) = *(uint *)(dev->addr + 0x4900) & 0xffffffbf;
      for (uVar32 = 0; uVar32 < (dev->ixy).num_tx_queues; uVar32 = uVar32 + 1) {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing tx queue %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x192,"init_tx",uVar32 & 0xffffffff,pvVar17);
        dVar36 = memory_allocate_dma(0x2000,true);
        pvVar19 = dVar36.virt;
        memset(pvVar19,0xff,0x2000);
        *(int *)(dev->addr + lVar33 * 4 + 0x6000) = (int)dVar36.phy;
        *(int *)(dev->addr + lVar33 * 4 + 0x6004) = dVar36.phy._4_4_;
        puVar15 = dev->addr + lVar33 * 4 + 0x6008;
        puVar15[0] = '\0';
        puVar15[1] = ' ';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        fprintf(_stderr,"[DEBUG] %s:%d %s(): tx ring %d phy addr:  0x%012lX\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x19c,"init_tx",uVar32 & 0xffffffff,dVar36.phy);
        pvVar17 = pvVar19;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): tx ring %d virt addr: 0x%012lX\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x19d,"init_tx",uVar32 & 0xffffffff);
        *(uint *)(dev->addr + lVar33 * 4 + 0x6028) =
             *(uint *)(dev->addr + lVar33 * 4 + 0x6028) & 0xff808080 | 0x40824;
        pvVar2 = dev->tx_queues;
        *(undefined2 *)((long)pvVar2 + lVar33 + 8) = 0x200;
        *(void **)((long)pvVar2 + lVar33) = pvVar19;
        lVar33 = lVar33 + 0x10;
      }
      puVar15 = dev->addr;
      puVar15[0x4a80] = '\x01';
      puVar15[0x4a81] = '\0';
      puVar15[0x4a82] = '\0';
      puVar15[0x4a83] = '\0';
      lVar33 = 0x18;
      uVar32 = 0;
      do {
        if ((dev->ixy).num_rx_queues <= uVar32) {
          iVar9 = 0x6028;
          lVar33 = 0;
          uVar32 = 0;
          while( true ) {
            if ((dev->ixy).num_tx_queues <= uVar32) {
              for (uVar24 = 0; uVar24 < (dev->ixy).num_rx_queues; uVar24 = uVar24 + 1) {
                enable_interrupt(dev,uVar24);
              }
              ixgbe_set_promisc((ixy_device *)dev,true);
              fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                      ,0x1b3,"wait_for_link");
              iVar9 = -10000000;
              while( true ) {
                uVar12 = ixgbe_get_link_speed((ixy_device *)dev);
                __stream = _stdout;
                if ((uVar12 != 0) || (iVar9 == 0)) break;
                usleep(100000);
                iVar9 = iVar9 + 100000;
              }
              uVar12 = ixgbe_get_link_speed((ixy_device *)dev);
              fprintf(__stream,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                      ,0x1ba,"wait_for_link",(ulong)uVar12);
              return &dev->ixy;
            }
            fprintf(_stderr,"[DEBUG] %s:%d %s(): starting tx queue %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                    ,0x138,"start_tx_queue",uVar32 & 0xffffffff,pvVar17);
            uVar24 = (ushort)*(undefined4 *)((long)dev->tx_queues + lVar33 + 8);
            if ((uVar24 & uVar24 - 1) != 0) break;
            puVar15 = dev->addr + lVar33 * 4 + 0x6010;
            puVar15[0] = '\0';
            puVar15[1] = '\0';
            puVar15[2] = '\0';
            puVar15[3] = '\0';
            puVar15 = dev->addr + lVar33 * 4 + 0x6018;
            puVar15[0] = '\0';
            puVar15[1] = '\0';
            puVar15[2] = '\0';
            puVar15[3] = '\0';
            *(uint *)(dev->addr + lVar33 * 4 + 0x6028) =
                 *(uint *)(dev->addr + lVar33 * 4 + 0x6028) | 0x2000000;
            wait_set_reg32(dev->addr,iVar9,0x2000000);
            uVar32 = uVar32 + 1;
            lVar33 = lVar33 + 0x10;
            iVar9 = iVar9 + 0x40;
          }
          pcVar14 = "[ERROR] %s:%d %s(): number of queue entries must be a power of 2\n";
          pcVar26 = "start_tx_queue";
          uVar23 = 0x13b;
LAB_0010431b:
          fprintf(_stderr,pcVar14,
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,uVar23,pcVar26);
          abort();
        }
        fprintf(_stderr,"[DEBUG] %s:%d %s(): starting rx queue %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x116,"start_rx_queue",uVar32 & 0xffffffff,pvVar17);
        pvVar2 = dev->rx_queues;
        lVar28 = uVar32 * 0x18;
        pmVar20 = memory_allocate_mempool(0x1000,0x800);
        *(mempool **)((long)pvVar2 + lVar28 + 8) = pmVar20;
        uVar10 = *(uint *)((long)pvVar2 + lVar28 + 0x10);
        if ((ushort)((ushort)uVar10 & (ushort)uVar10 - 1) != 0) {
          pcVar14 = "[ERROR] %s:%d %s(): number of queue entries must be a power of 2\n";
          pcVar26 = "start_rx_queue";
          uVar23 = 0x121;
          goto LAB_0010431b;
        }
        plVar29 = (long *)(lVar28 + (long)pvVar2);
        lVar28 = 8;
        for (uVar31 = 0; uVar31 < (uVar10 & 0xffff); uVar31 = uVar31 + 1) {
          lVar30 = *plVar29;
          ppVar21 = pkt_buf_alloc((mempool *)plVar29[1]);
          if (ppVar21 == (pkt_buf *)0x0) {
            pcVar14 = "[ERROR] %s:%d %s(): failed to allocate rx descriptor\n";
            pcVar26 = "start_rx_queue";
            uVar23 = 0x127;
            goto LAB_0010431b;
          }
          *(uintptr_t *)(lVar30 + -8 + lVar28) = ppVar21->buf_addr_phy + 0x40;
          *(undefined8 *)(lVar30 + lVar28) = 0;
          *(pkt_buf **)((long)pvVar2 + uVar31 * 8 + lVar33) = ppVar21;
          lVar28 = lVar28 + 0x10;
          uVar10 = (uint)*(ushort *)(plVar29 + 2);
        }
        uVar31 = (ulong)(uint)((int)uVar32 << 6);
        bVar35 = uVar32 < 0x40;
        lVar28 = 0xc028;
        if (bVar35) {
          lVar28 = 0x1028;
        }
        lVar30 = 0xc010;
        if (bVar35) {
          lVar30 = 0x1010;
        }
        lVar34 = 0xc018;
        if (bVar35) {
          lVar34 = 0x1018;
        }
        lVar28 = lVar28 + uVar31;
        *(uint *)(dev->addr + lVar28) = *(uint *)(dev->addr + lVar28) | 0x2000000;
        wait_set_reg32(dev->addr,(int)lVar28,0x2000000);
        uVar32 = uVar32 + 1;
        puVar15 = dev->addr + lVar30 + uVar31;
        puVar15[0] = '\0';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        *(uint *)(dev->addr + lVar34 + uVar31) = *(ushort *)(plVar29 + 2) - 1;
        lVar33 = lVar33 + 0x18;
      } while( true );
    }
    pcVar14 = "[ERROR] %s:%d %s(): cannot configure %d tx queues: limit is %d\n";
    uVar23 = 0x209;
    uVar32 = (ulong)tx_queues;
  }
  else {
    pcVar14 = "[ERROR] %s:%d %s(): cannot configure %d rx queues: limit is %d\n";
    uVar23 = 0x206;
  }
  fprintf(_stderr,pcVar14,
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          uVar23,"ixgbe_init",uVar32,CONCAT44((int)(in_stack_ffffffffffffeed8 >> 0x20),0x40));
  abort();
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}

	// Allocate memory for the ixgbe device that will be returned
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);

	// Check if we want the VFIO stuff
	// This is done by checking if the device is in an IOMMU group.
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/iommu_group", pci_addr);
	struct stat buffer;
	dev->ixy.vfio = stat(path, &buffer) == 0;
	if (dev->ixy.vfio) {
		// initialize the IOMMU for this device
		dev->ixy.vfio_fd = vfio_init(pci_addr);
		if (dev->ixy.vfio_fd < 0) {
			error("could not initialize the IOMMU for device %s", pci_addr);
		}
	}
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->ixy.get_mac_addr = ixgbe_get_mac_addr;
	dev->ixy.set_mac_addr = ixgbe_set_mac_addr;
	dev->ixy.interrupts.interrupts_enabled = interrupt_timeout != 0;
	// 0x028 (10ys) => 97600 INT/s
	dev->ixy.interrupts.itr_rate = 0x028;
	dev->ixy.interrupts.timeout_ms = interrupt_timeout;

	if (!dev->ixy.vfio && interrupt_timeout != 0) {
		warn("Interrupts requested but VFIO not available: Disabling Interrupts!");
		dev->ixy.interrupts.interrupts_enabled = false;
	}

	// Map BAR0 region
	if (dev->ixy.vfio) {
		debug("mapping BAR0 region via VFIO...");
		dev->addr = vfio_map_region(dev->ixy.vfio_fd, VFIO_PCI_BAR0_REGION_INDEX);
		// initialize interrupts for this device
		setup_interrupts(dev);
	} else {
		debug("mapping BAR0 region via pci file...");
		dev->addr = pci_map_resource(pci_addr);
	}
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}